

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

RunResult wabt::interp::IntDiv<long>(long lhs,long rhs,long *out,string *out_msg)

{
  bool bVar1;
  string *out_msg_local;
  long *out_local;
  long rhs_local;
  long lhs_local;
  
  if (rhs == 0) {
    std::__cxx11::string::operator=((string *)out_msg,"integer divide by zero");
    lhs_local._4_4_ = Trap;
  }
  else {
    bVar1 = IsNormalDivRem<long,_0>(lhs,rhs);
    if (bVar1) {
      *out = lhs / rhs;
      lhs_local._4_4_ = Ok;
    }
    else {
      std::__cxx11::string::operator=((string *)out_msg,"integer overflow");
      lhs_local._4_4_ = Trap;
    }
  }
  return lhs_local._4_4_;
}

Assistant:

RunResult WABT_VECTORCALL IntDiv(T lhs, T rhs, T* out, std::string* out_msg) {
  if (WABT_UNLIKELY(rhs == 0)) {
    *out_msg = "integer divide by zero";
    return RunResult::Trap;
  }
  if (WABT_LIKELY(IsNormalDivRem(lhs, rhs))) {
    *out = lhs / rhs;
    return RunResult::Ok;
  } else {
    *out_msg = "integer overflow";
    return RunResult::Trap;
  }
}